

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_vtlb.c
# Opt level: O3

_Bool unicorn_fill_tlb_mips64el
                (CPUState *cs,vaddr address,int size,MMUAccessType rw,int mmu_idx,_Bool probe,
                uintptr_t retaddr)

{
  uc_struct_conflict7 *puVar1;
  void *pvVar2;
  CPUState *cpu;
  char cVar3;
  uint uVar4;
  bool bVar5;
  list_item *plVar6;
  ulong uVar7;
  byte bVar8;
  ulong local_50;
  uint local_48;
  int local_3c;
  CPUState *local_38;
  
  puVar1 = cs->uc;
  plVar6 = puVar1->hook[0x11].head;
  uVar7 = address & 0xfffffffffffff000;
  local_3c = mmu_idx;
  local_38 = cs;
  if (plVar6 != (list_item *)0x0) {
    bVar8 = 0x12;
    if (rw != MMU_INST_FETCH) {
      bVar8 = rw == MMU_DATA_STORE | 0x10;
    }
    bVar5 = false;
    do {
      pvVar2 = plVar6->data;
      if (pvVar2 == (void *)0x0) break;
      if ((*(char *)((long)pvVar2 + 0x14) == '\0') &&
         (*(ulong *)((long)pvVar2 + 0x20) < *(ulong *)((long)pvVar2 + 0x18) ||
          address <= *(ulong *)((long)pvVar2 + 0x20) && *(ulong *)((long)pvVar2 + 0x18) <= address))
      {
        cVar3 = (**(code **)((long)pvVar2 + 0x28))
                          (puVar1,uVar7,bVar8,&local_50,*(undefined8 *)((long)pvVar2 + 0x30));
        bVar5 = true;
        if (cVar3 != '\0') goto LAB_0094071b;
      }
      plVar6 = plVar6->next;
    } while (plVar6 != (list_item *)0x0);
    if (bVar5) goto LAB_00940783;
  }
  local_50 = uVar7;
  if (rw == MMU_INST_FETCH) {
    local_48 = 4;
LAB_0094074c:
    uVar4 = local_48 >> 2 & 0x3f;
  }
  else if (rw == MMU_DATA_STORE) {
    local_48 = 2;
LAB_0094073d:
    uVar4 = local_48 >> 1 & 0x7f;
  }
  else if (rw == MMU_DATA_LOAD) {
    local_48 = 1;
    uVar4 = local_48;
  }
  else {
    local_48 = 0;
LAB_0094071b:
    if (rw == MMU_INST_FETCH) goto LAB_0094074c;
    if (rw == MMU_DATA_STORE) goto LAB_0094073d;
    uVar4 = local_48;
    if (rw != MMU_DATA_LOAD) goto LAB_00940783;
  }
  if ((uVar4 & 1) != 0) {
    tlb_set_page_mips64el
              (local_38,address & 0xfffffffffffff000,local_50 & 0xfffffffffffff000,local_48 & 7,
               local_3c,0x1000);
    return true;
  }
LAB_00940783:
  cpu = local_38;
  if (probe) {
    return false;
  }
  puVar1 = local_38->uc;
  puVar1->invalid_error = 0x15;
  puVar1->invalid_addr = address;
  cpu_exit(puVar1->cpu);
  cpu_loop_exit_restore_mips64el(cpu,retaddr);
}

Assistant:

bool unicorn_fill_tlb(CPUState *cs, vaddr address, int size,
                      MMUAccessType rw, int mmu_idx,
                      bool probe, uintptr_t retaddr)
{
    bool handled = false;
    bool ret = false;
    struct uc_struct *uc = cs->uc;
    uc_tlb_entry e;
    struct hook *hook;
    HOOK_FOREACH_VAR_DECLARE;

    HOOK_FOREACH(uc, hook, UC_HOOK_TLB_FILL) {
        if (hook->to_delete) {
            continue;
        }
        if (!HOOK_BOUND_CHECK(hook, address)) {
            continue;
        }
        handled = true;
        if ((ret = ((uc_cb_tlbevent_t)hook->callback)(uc, address & TARGET_PAGE_MASK, rw_to_mem_type(rw), &e, hook->user_data))) {
            break;
        }
    }

    if (handled && !ret) {
        goto tlb_miss;
    }

    if (!handled) {
        e.paddr = address & TARGET_PAGE_MASK;
        switch (rw) {
        case MMU_DATA_LOAD:
            e.perms = UC_PROT_READ;
            break;
        case MMU_DATA_STORE:
            e.perms = UC_PROT_WRITE;
            break;
        case MMU_INST_FETCH:
            e.perms = UC_PROT_EXEC;
            break;
        default:
            e.perms = 0;
            break;
        }
    }

    switch (rw) {
    case MMU_DATA_LOAD:
        ret = e.perms & UC_PROT_READ;
        break;
    case MMU_DATA_STORE:
        ret = e.perms & UC_PROT_WRITE;
        break;
    case MMU_INST_FETCH:
        ret = e.perms & UC_PROT_EXEC;
        break;
    default:
        ret = false;
        break;
    }

    if (ret) {
        tlb_set_page(cs, address & TARGET_PAGE_MASK, e.paddr & TARGET_PAGE_MASK, perms_to_prot(e.perms), mmu_idx, TARGET_PAGE_SIZE);
        return true;
    }

tlb_miss:
    if (probe) {
        return false;
    }
    raise_mmu_exception(cs, address, rw, retaddr);
    return false;
}